

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

SeatPromptResult *
term_get_userpass_input(SeatPromptResult *__return_storage_ptr__,Terminal *term,prompts_t *p)

{
  prompt_t *ppVar1;
  _func_void_SeatPromptResult_BinarySink_ptr *p_Var2;
  SeatPromptResult spr_00;
  undefined4 uVar3;
  SeatPromptResultKind SVar4;
  undefined4 uVar5;
  _Bool _Var6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  strbuf *psVar10;
  wchar_t i;
  long lVar11;
  ptrlen pVar12;
  LdiscInputToken LVar13;
  ptrlen suffix;
  ptrlen suffix_00;
  char c;
  ulong *local_a0;
  SeatPromptResult *local_98;
  SeatPromptResult spr_1;
  SeatPromptResult spr;
  SeatPromptResult local_50;
  
  if (term->ldisc == (Ldisc *)0x0) {
    make_spr_sw_abort_static(&local_50,"Terminal not prepared for interactive prompts");
    spr_1._4_4_ = local_50._4_4_;
    spr_1.errfn._0_4_ = local_50.errfn._0_4_;
    spr_1.errfn._4_4_ = local_50.errfn._4_4_;
    spr_1.errdata_u = local_50.errdata_u;
    spr_1._28_4_ = local_50._28_4_;
  }
  else {
    if ((p->spr).kind != SPRK_INCOMPLETE) {
      SVar4 = (p->spr).kind;
      uVar5 = *(undefined4 *)&(p->spr).field_0x4;
      p_Var2 = (p->spr).errfn;
      uVar8 = (p->spr).errdata_u;
      uVar3 = *(undefined4 *)&(p->spr).field_0x1c;
      __return_storage_ptr__->errdata_lit = (p->spr).errdata_lit;
      __return_storage_ptr__->errdata_u = uVar8;
      *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar3;
      __return_storage_ptr__->kind = SVar4;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar5;
      __return_storage_ptr__->errfn = p_Var2;
      return __return_storage_ptr__;
    }
    local_a0 = (ulong *)p->data;
    local_98 = __return_storage_ptr__;
    if (local_a0 == (ulong *)0x0) {
      local_a0 = (ulong *)safemalloc(1,0x10,0);
      p->data = local_a0;
      (p->spr).kind = SPRK_INCOMPLETE;
      (p->spr).errdata_lit = (char *)0x0;
      *local_a0 = 0;
      *(undefined1 *)(local_a0 + 1) = 0;
      if ((p->name_reqd == true) && (p->name != (char *)0x0)) {
        pVar12 = ptrlen_from_asciz(p->name);
        term_data(term,pVar12.ptr,pVar12.len);
        suffix.len = 1;
        suffix.ptr = "\n";
        _Var6 = ptrlen_endswith(pVar12,suffix,(ptrlen *)0x0);
        if (!_Var6) {
          term_data(term,"\r\n",2);
        }
      }
      if (p->instruction != (char *)0x0) {
        pVar12 = ptrlen_from_asciz(p->instruction);
        term_data(term,pVar12.ptr,pVar12.len);
        suffix_00.len = 1;
        suffix_00.ptr = "\n";
        _Var6 = ptrlen_endswith(pVar12,suffix_00,(ptrlen *)0x0);
        if (!_Var6) {
          term_data(term,"\r\n",2);
        }
      }
      for (lVar11 = 0; lVar11 < (int)p->n_prompts; lVar11 = lVar11 + 1) {
        prompt_set_result(p->prompts[lVar11],"");
      }
    }
LAB_0010f155:
    uVar7 = *local_a0;
    uVar9 = p->n_prompts;
    if (uVar7 < uVar9) {
      ppVar1 = p->prompts[uVar7];
      if ((char)local_a0[1] == '\0') {
        pVar12 = ptrlen_from_asciz(ppVar1->prompt);
        term_data(term,pVar12.ptr,pVar12.len);
        *(undefined1 *)(local_a0 + 1) = 1;
      }
      _Var6 = ldisc_has_input_buffered(term->ldisc);
      if (!_Var6) {
        uVar7 = *local_a0;
        uVar9 = p->n_prompts;
        goto LAB_0010f480;
      }
      do {
        while( true ) {
          _Var6 = ldisc_has_input_buffered(term->ldisc);
          if (!_Var6) goto LAB_0010f155;
          LVar13 = ldisc_get_input_token(term->ldisc);
          uVar8 = LVar13.field_1._0_4_;
          if (((undefined1  [12])LVar13 & (undefined1  [12])0x1) != (undefined1  [12])0x0) break;
          c = LVar13.field_1._0_1_;
          uVar8 = uVar8 & 0xff;
          switch(uVar8) {
          case 3:
          case 4:
switchD_0010f25e_caseD_3:
            term_data(term,"\r\n",2);
            safefree(local_a0);
            p->data = (void *)0x0;
            local_50.errdata_lit._0_4_ = 0;
            local_50.errdata_lit._4_4_ = 0;
            spr_1.errdata_u = spr.errdata_u;
            spr_1._28_4_ = spr._28_4_;
            local_50.kind = SPRK_USER_ABORT;
            __return_storage_ptr__ = local_98;
            goto LAB_0010f35c;
          case 5:
          case 6:
          case 7:
          case 9:
          case 0xb:
          case 0xc:
switchD_0010f25e_caseD_5:
            if (((ppVar1->echo != true) || (0x9f < (byte)c || (byte)(c - 0x20U) < 0x5f)) &&
               (BinarySink_put_byte(ppVar1->result->binarysink_,c), ppVar1->echo == true)) {
              term_data(term,&c,1);
            }
            break;
          case 8:
switchD_0010f25e_caseD_8:
            psVar10 = ppVar1->result;
            if (psVar10->len != 0) {
              if (ppVar1->echo == true) {
                term_data(term,"\b \b",3);
                psVar10 = ppVar1->result;
              }
              strbuf_shrink_by(psVar10,1);
            }
            break;
          case 10:
          case 0xd:
            goto switchD_0010f25e_caseD_a;
          default:
            if (uVar8 != 0x15) {
              if (uVar8 == 0x7f) goto switchD_0010f25e_caseD_8;
              if (uVar8 != 0x1b) goto switchD_0010f25e_caseD_5;
            }
            while (psVar10 = ppVar1->result, psVar10->len != 0) {
              if (ppVar1->echo == true) {
                term_data(term,"\b \b",3);
                psVar10 = ppVar1->result;
              }
              strbuf_shrink_by(psVar10,1);
            }
          }
        }
        if (LVar13._0_8_ >> 0x20 == 6) {
          c = '\b';
          goto switchD_0010f25e_caseD_8;
        }
        if ((uVar8 == 1) || (uVar8 == 0xb)) {
          c = '\x03';
          goto switchD_0010f25e_caseD_3;
        }
      } while (uVar8 != 0xe);
      c = '\r';
switchD_0010f25e_caseD_a:
      term_data(term,"\r\n",2);
      *local_a0 = *local_a0 + 1;
      *(undefined1 *)(local_a0 + 1) = 0;
      goto LAB_0010f155;
    }
LAB_0010f480:
    __return_storage_ptr__ = local_98;
    if (uVar7 < uVar9) {
      ldisc_enable_prompt_callback(term->ldisc,p);
      __return_storage_ptr__->kind = SPRK_INCOMPLETE;
      __return_storage_ptr__->errdata_lit = (char *)0x0;
      return __return_storage_ptr__;
    }
    safefree(local_a0);
    p->data = (void *)0x0;
    spr_1.kind = SPRK_OK;
    spr_1.errdata_lit = (char *)0x0;
    spr_1.errdata_lit._0_4_ = 0;
    spr_1.errdata_lit._4_4_ = 0;
    local_50.kind = spr_1.kind;
    local_50.errdata_lit._0_4_ = spr_1.errdata_lit._0_4_;
    local_50.errdata_lit._4_4_ = spr_1.errdata_lit._4_4_;
  }
  spr.errfn = (_func_void_SeatPromptResult_BinarySink_ptr *)
              CONCAT44(spr_1.errfn._4_4_,spr_1.errfn._0_4_);
  spr._4_4_ = spr_1._4_4_;
LAB_0010f35c:
  spr_00._4_4_ = spr._4_4_;
  spr_00.kind = local_50.kind;
  spr_00.errfn._0_4_ = (int)spr.errfn;
  spr_00.errfn._4_4_ = (int)((ulong)spr.errfn >> 0x20);
  spr_00.errdata_lit._0_4_ = local_50.errdata_lit._0_4_;
  spr_00.errdata_lit._4_4_ = local_50.errdata_lit._4_4_;
  spr_00.errdata_u = spr_1.errdata_u;
  spr_00._28_4_ = spr_1._28_4_;
  signal_prompts_t(__return_storage_ptr__,term,p,spr_00);
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult term_get_userpass_input(Terminal *term, prompts_t *p)
{
    if (!term->ldisc) {
        /* Can't handle interactive prompts without an ldisc */
        return signal_prompts_t(term, p, SPR_SW_ABORT(
            "Terminal not prepared for interactive prompts"));
    }

    if (p->spr.kind != SPRK_INCOMPLETE) {
        /* We've already finished these prompts, so return the same
         * result again */
        return p->spr;
    }

    struct term_userpass_state *s = (struct term_userpass_state *)p->data;

    if (!s) {
        /*
         * First call. Set some stuff up.
         */
        p->data = s = snew(struct term_userpass_state);
        p->spr = SPR_INCOMPLETE;
        s->curr_prompt = 0;
        s->done_prompt = false;
        /* We only print the `name' caption if we have to... */
        if (p->name_reqd && p->name) {
            ptrlen plname = ptrlen_from_asciz(p->name);
            term_write(term, plname);
            if (!ptrlen_endswith(plname, PTRLEN_LITERAL("\n"), NULL))
                term_write(term, PTRLEN_LITERAL("\r\n"));
        }
        /* ...but we always print any `instruction'. */
        if (p->instruction) {
            ptrlen plinst = ptrlen_from_asciz(p->instruction);
            term_write(term, plinst);
            if (!ptrlen_endswith(plinst, PTRLEN_LITERAL("\n"), NULL))
                term_write(term, PTRLEN_LITERAL("\r\n"));
        }
        /*
         * Zero all the results, in case we abort half-way through.
         */
        {
            int i;
            for (i = 0; i < (int)p->n_prompts; i++)
                prompt_set_result(p->prompts[i], "");
        }
    }

    while (s->curr_prompt < p->n_prompts) {

        prompt_t *pr = p->prompts[s->curr_prompt];
        bool finished_prompt = false;

        if (!s->done_prompt) {
            term_write(term, ptrlen_from_asciz(pr->prompt));
            s->done_prompt = true;
        }

        /* Breaking out here ensures that the prompt is printed even
         * if we're now waiting for user data. */
        if (!ldisc_has_input_buffered(term->ldisc))
            break;

        /* FIXME: should we be using local-line-editing code instead? */
        while (!finished_prompt && ldisc_has_input_buffered(term->ldisc)) {
            LdiscInputToken tok = ldisc_get_input_token(term->ldisc);

            char c;
            if (tok.is_special) {
                switch (tok.code) {
                  case SS_EOL: c = 13; break;
                  case SS_EC: c = 8; break;
                  case SS_IP: c = 3; break;
                  case SS_EOF: c = 3; break;
                  default: continue;
                }
            } else {
                c = tok.chr;
            }

            switch (c) {
              case 10:
              case 13:
                term_write(term, PTRLEN_LITERAL("\r\n"));
                /* go to next prompt, if any */
                s->curr_prompt++;
                s->done_prompt = false;
                finished_prompt = true; /* break out */
                break;
              case 8:
              case 127:
                if (pr->result->len > 0) {
                    if (pr->echo)
                        term_write(term, PTRLEN_LITERAL("\b \b"));
                    strbuf_shrink_by(pr->result, 1);
                }
                break;
              case 21:
              case 27:
                while (pr->result->len > 0) {
                    if (pr->echo)
                        term_write(term, PTRLEN_LITERAL("\b \b"));
                    strbuf_shrink_by(pr->result, 1);
                }
                break;
              case 3:
              case 4:
                /* Immediate abort. */
                term_write(term, PTRLEN_LITERAL("\r\n"));
                sfree(s);
                p->data = NULL;
                return signal_prompts_t(term, p, SPR_USER_ABORT);
              default:
                /*
                 * This simplistic check for printability is disabled
                 * when we're doing password input, because some people
                 * have control characters in their passwords.
                 */
                if (!pr->echo || (c >= ' ' && c <= '~') ||
                     ((unsigned char) c >= 160)) {
                    put_byte(pr->result, c);
                    if (pr->echo)
                        term_write(term, make_ptrlen(&c, 1));
                }
                break;
            }
        }

    }

    if (s->curr_prompt < p->n_prompts) {
        ldisc_enable_prompt_callback(term->ldisc, p);
        return SPR_INCOMPLETE;
    } else {
        sfree(s);
        p->data = NULL;
        return signal_prompts_t(term, p, SPR_OK);
    }
}